

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O0

error_code libtorrent::natpmp::from_result_code(int version,int result)

{
  pcp_errors local_20;
  int result_local;
  int version_local;
  
  local_20 = result;
  if (version == 0) {
    if (result == 3) {
      local_20 = pcp_network_failure;
    }
    else if (result == 4) {
      local_20 = pcp_no_resources;
    }
    else if (result == 5) {
      local_20 = pcp_unsupp_opcode;
    }
  }
  boost::system::error_code::error_code<libtorrent::errors::pcp_errors>
            ((error_code *)&result_local,local_20,(type *)0x0);
  return _result_local;
}

Assistant:

error_code natpmp::from_result_code(int const version, int result)
{
	if (version == version_natpmp)
	{
		// a few nat-pmp result codes map to different codes
		// in pcp
		switch (result)
		{
		case 3:result = 7; break;
		case 4:result = 8; break;
		case 5:result = 4; break;
		}
	}
	return errors::pcp_errors(result);
}